

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

u64 filterHash(Mem *aMem,Op *pOp)

{
  ushort uVar1;
  long lVar2;
  int in_EDX;
  Mem *pMem;
  u64 uVar3;
  long lVar4;
  
  if (in_EDX < 1) {
    uVar3 = 0;
  }
  else {
    lVar4 = (long)(int)pOp;
    pMem = aMem + lVar4;
    uVar3 = 0;
    do {
      uVar1 = pMem->flags;
      if ((uVar1 & 0x24) == 0) {
        if ((uVar1 & 8) == 0) {
          if (((uVar1 & 0x12) == 0) || (uVar3 = uVar3 + (long)pMem->n, (uVar1 >> 10 & 1) == 0))
          goto LAB_0014569a;
          lVar2 = (long)(pMem->u).nZero;
        }
        else {
          lVar2 = sqlite3VdbeIntValue(pMem);
        }
        uVar3 = uVar3 + lVar2;
      }
      else {
        uVar3 = uVar3 + (long)(pMem->u).zPType;
      }
LAB_0014569a:
      lVar4 = lVar4 + 1;
      pMem = pMem + 1;
    } while (lVar4 < in_EDX + (int)pOp);
  }
  return uVar3;
}

Assistant:

static u64 filterHash(const Mem *aMem, const Op *pOp){
  int i, mx;
  u64 h = 0;

  assert( pOp->p4type==P4_INT32 );
  for(i=pOp->p3, mx=i+pOp->p4.i; i<mx; i++){
    const Mem *p = &aMem[i];
    if( p->flags & (MEM_Int|MEM_IntReal) ){
      h += p->u.i;
    }else if( p->flags & MEM_Real ){
      h += sqlite3VdbeIntValue(p);
    }else if( p->flags & (MEM_Str|MEM_Blob) ){
      h += p->n;
      if( p->flags & MEM_Zero ) h += p->u.nZero;
    }
  }
  return h;
}